

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_htmlspecialchars_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  undefined8 in_RAX;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  jx9_value *pjVar7;
  long lVar8;
  char *pcVar9;
  char *zLeft;
  int nLen;
  undefined8 local_38;
  
  local_38._4_4_ = (int)((ulong)in_RAX >> 0x20);
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pcVar3 = jx9_value_to_string(*apArg,(int *)((long)&local_38 + 4));
    iVar5 = local_38._4_4_;
    lVar8 = (long)local_38._4_4_;
    local_38 = CONCAT44(local_38._4_4_,1);
    if (nArg != 1) {
      pjVar7 = apArg[1];
      jx9MemObjToInteger(pjVar7);
      iVar1 = *(int *)&pjVar7->x;
      iVar4 = 1;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      local_38 = CONCAT44(local_38._4_4_,iVar4);
    }
    if (0 < iVar5) {
      pcVar9 = pcVar3 + lVar8;
      zLeft = pcVar3;
LAB_0012fbe1:
      do {
        if (*zLeft != '&') {
          zLeft = zLeft + 1;
          if (zLeft < pcVar9) goto LAB_0012fbe1;
        }
        if (pcVar3 < zLeft) {
          jx9_value_string(pCtx->pRet,pcVar3,(int)zLeft - (int)pcVar3);
        }
        uVar6 = (int)pcVar9 - (int)zLeft;
        local_38 = CONCAT44(uVar6,(undefined4)local_38);
        if ((int)uVar6 < 5) {
          if (uVar6 == 4) goto LAB_0012fc51;
          if ((int)uVar6 < 1) {
            return 0;
          }
          goto LAB_0012fcd9;
        }
        sVar2 = SyStrnicmp(zLeft,"&amp;",5);
        if (sVar2 == 0) {
          jx9_value_string(pCtx->pRet,"&",1);
          lVar8 = 5;
        }
        else {
LAB_0012fc51:
          sVar2 = SyStrnicmp(zLeft,"&lt;",4);
          if (sVar2 == 0) {
            pjVar7 = pCtx->pRet;
            pcVar3 = "<";
          }
          else {
            sVar2 = SyStrnicmp(zLeft,"&gt;",4);
            if (sVar2 != 0) {
              if (uVar6 < 6) {
LAB_0012fcd9:
                jx9_value_string(pCtx->pRet,"&",1);
                lVar8 = 1;
                goto LAB_0012fd18;
              }
              sVar2 = SyStrnicmp(zLeft,"&quot;",6);
              if (sVar2 == 0) {
                pjVar7 = pCtx->pRet;
                if ((local_38 & 4) != 0) {
                  pcVar3 = "&quot;";
                  goto LAB_0012fd46;
                }
                pcVar3 = "\"";
LAB_0012fd54:
                iVar5 = 1;
              }
              else {
                sVar2 = SyStrnicmp(zLeft,"&#039;",6);
                if (sVar2 != 0) goto LAB_0012fcd9;
                pjVar7 = pCtx->pRet;
                if ((local_38 & 2) != 0) {
                  pcVar3 = "\'";
                  goto LAB_0012fd54;
                }
                pcVar3 = "&#039;";
LAB_0012fd46:
                iVar5 = 6;
              }
              jx9_value_string(pjVar7,pcVar3,iVar5);
              lVar8 = 6;
              goto LAB_0012fd18;
            }
            pjVar7 = pCtx->pRet;
            pcVar3 = ">";
          }
          jx9_value_string(pjVar7,pcVar3,1);
          lVar8 = 4;
        }
LAB_0012fd18:
        pcVar3 = zLeft + lVar8;
        zLeft = pcVar3;
      } while (pcVar3 < pcVar9);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlspecialchars_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zCur, *zIn, *zEnd;
	int iFlags = 0x01; /* ENT_COMPAT */
	int nLen, nJump;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '&' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Append the raw string verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		nLen = (int)(zEnd-zIn);
		nJump = (int)sizeof(char);
		if( nLen >= (int)sizeof("&amp;")-1 && SyStrnicmp(zIn, "&amp;", sizeof("&amp;")-1) == 0 ){
			/* &amp; ==> '&' */
			jx9_result_string(pCtx, "&", (int)sizeof(char));
			nJump = (int)sizeof("&amp;")-1;
		}else if( nLen >= (int)sizeof("&lt;")-1 && SyStrnicmp(zIn, "&lt;", sizeof("&lt;")-1) == 0 ){
			/* &lt; ==> < */
			jx9_result_string(pCtx, "<", (int)sizeof(char));
			nJump = (int)sizeof("&lt;")-1; 
		}else if( nLen >= (int)sizeof("&gt;")-1 && SyStrnicmp(zIn, "&gt;", sizeof("&gt;")-1) == 0 ){
			/* &gt; ==> '>' */
			jx9_result_string(pCtx, ">", (int)sizeof(char));
			nJump = (int)sizeof("&gt;")-1; 
		}else if( nLen >= (int)sizeof("&quot;")-1 && SyStrnicmp(zIn, "&quot;", sizeof("&quot;")-1) == 0 ){
			/* &quot; ==> '"' */
			if( (iFlags & 0x04) == 0 /*ENT_NOQUOTES*/ ){
				jx9_result_string(pCtx, "\"", (int)sizeof(char));
			}else{
				/* Leave untouched */
				jx9_result_string(pCtx, "&quot;", (int)sizeof("&quot;")-1);
			}
			nJump = (int)sizeof("&quot;")-1;
		}else if( nLen >= (int)sizeof("&#039;")-1 && SyStrnicmp(zIn, "&#039;", sizeof("&#039;")-1) == 0 ){
			/* &#039; ==> ''' */
			if( iFlags & 0x02 /*ENT_QUOTES*/ ){
				/* Expand ''' */
				jx9_result_string(pCtx, "'", (int)sizeof(char));
			}else{
				/* Leave untouched */
				jx9_result_string(pCtx, "&#039;", (int)sizeof("&#039;")-1);
			}
			nJump = (int)sizeof("&#039;")-1;
		}else if( nLen >= (int)sizeof(char) ){
			/* expand '&' */
			jx9_result_string(pCtx, "&", (int)sizeof(char));
		}else{
			/* No more input to process */
			break;
		}
		zIn += nJump;
	}
	return JX9_OK;
}